

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_threads.c
# Opt level: O0

ares_status_t ares_channel_threading_init(ares_channel_t *channel)

{
  ares_bool_t aVar1;
  ares_thread_mutex_t *paVar2;
  ares_thread_cond_t *paVar3;
  ares_status_t local_1c;
  ares_status_t status;
  ares_channel_t *channel_local;
  
  local_1c = ARES_SUCCESS;
  aVar1 = ares_threadsafety();
  if (aVar1 == ARES_FALSE) {
    channel_local._4_4_ = ARES_SUCCESS;
  }
  else {
    paVar2 = ares_thread_mutex_create();
    channel->lock = paVar2;
    if (channel->lock == (ares_thread_mutex_t *)0x0) {
      local_1c = ARES_ENOMEM;
    }
    else {
      paVar3 = ares_thread_cond_create();
      channel->cond_empty = paVar3;
      if (channel->cond_empty == (ares_thread_cond_t *)0x0) {
        local_1c = ARES_ENOMEM;
      }
    }
    if (local_1c != ARES_SUCCESS) {
      ares_channel_threading_destroy(channel);
    }
    channel_local._4_4_ = local_1c;
  }
  return channel_local._4_4_;
}

Assistant:

ares_status_t ares_channel_threading_init(ares_channel_t *channel)
{
  ares_status_t status = ARES_SUCCESS;

  /* Threading is optional! */
  if (!ares_threadsafety()) {
    return ARES_SUCCESS;
  }

  channel->lock = ares_thread_mutex_create();
  if (channel->lock == NULL) {
    status = ARES_ENOMEM;
    goto done;
  }

  channel->cond_empty = ares_thread_cond_create();
  if (channel->cond_empty == NULL) {
    status = ARES_ENOMEM;
    goto done;
  }

done:
  if (status != ARES_SUCCESS) {
    ares_channel_threading_destroy(channel);
  }
  return status;
}